

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_MNDX.cpp
# Opt level: O0

int __thiscall TFileNameDatabase::LoadFromStream(TFileNameDatabase *this,TByteStream *InStream)

{
  int iVar1;
  TFileNameDatabase *this_00;
  TFileNameDatabase *pNewDB;
  int nError;
  DWORD dwBitMask;
  TByteStream *InStream_local;
  TFileNameDatabase *this_local;
  
  _nError = InStream;
  InStream_local = (TByteStream *)this;
  pNewDB._0_4_ = TSparseArray::LoadFromStream(&this->CollisionTable,InStream);
  if ((int)pNewDB != 0) {
    return (int)pNewDB;
  }
  pNewDB._0_4_ = TSparseArray::LoadFromStream(&this->FileNameIndexes,_nError);
  if ((int)pNewDB != 0) {
    return (int)pNewDB;
  }
  pNewDB._0_4_ = TSparseArray::LoadFromStream(&this->CollisionHiBitsIndexes,_nError);
  if ((int)pNewDB != 0) {
    return (int)pNewDB;
  }
  pNewDB._0_4_ = TGenericArray<unsigned_char>::LoadFromStream(&this->LoBitsTable,_nError);
  if ((int)pNewDB == 0) {
    pNewDB._0_4_ = TBitEntryArray::LoadBitsFromStream(&this->HiBitsTable,_nError);
    if ((int)pNewDB != 0) {
      return (int)pNewDB;
    }
    pNewDB._0_4_ = TPathFragmentTable::LoadFromStream(&this->PathFragmentTable,_nError);
    if ((int)pNewDB != 0) {
      return (int)pNewDB;
    }
    if (((this->CollisionHiBitsIndexes).ValidItemCount != 0) &&
       ((this->PathFragmentTable).PathFragments.ItemCount == 0)) {
      this_00 = (TFileNameDatabase *)operator_new(0x248);
      TFileNameDatabase(this_00);
      if (this_00 == (TFileNameDatabase *)0x0) {
        return 0xc;
      }
      pNewDB._0_4_ = SetChildDatabase(this,this_00);
      if ((int)pNewDB != 0) {
        return (int)pNewDB;
      }
      iVar1 = LoadFromStream(this->pChildDB,_nError);
      if (iVar1 != 0) {
        return iVar1;
      }
    }
    pNewDB._0_4_ = 0;
    pNewDB._0_4_ = TGenericArray<_HASH_ENTRY>::LoadFromStream(&this->HashTable,_nError);
    this_local._4_4_ = (int)pNewDB;
    if ((int)pNewDB == 0) {
      this->HashTableMask = (this->HashTable).ItemCount - 1;
      pNewDB._0_4_ = TByteStream::GetValue<unsigned_int>(_nError,&this->field_214);
      this_local._4_4_ = (int)pNewDB;
      if (((int)pNewDB == 0) &&
         (pNewDB._0_4_ = TByteStream::GetValue<unsigned_int>(_nError,(uint *)((long)&pNewDB + 4)),
         this_local._4_4_ = (int)pNewDB, (int)pNewDB == 0)) {
        this_local._4_4_ = TStruct10::sub_1957800(&this->Struct10,pNewDB._4_4_);
      }
    }
    return this_local._4_4_;
  }
  return (int)pNewDB;
}

Assistant:

int LoadFromStream(TByteStream & InStream)
    {
        DWORD dwBitMask;
        int nError;

        nError = CollisionTable.LoadFromStream(InStream);
        if(nError != ERROR_SUCCESS)
            return nError;

        nError = FileNameIndexes.LoadFromStream(InStream);
        if(nError != ERROR_SUCCESS)
            return nError;

        nError = CollisionHiBitsIndexes.LoadFromStream(InStream);
        if(nError != ERROR_SUCCESS)
            return nError;

        // HOTS: 019597CD
        nError = LoBitsTable.LoadFromStream(InStream);
        if(nError != ERROR_SUCCESS)
            return nError;

        nError = HiBitsTable.LoadBitsFromStream(InStream);
        if(nError != ERROR_SUCCESS)
            return nError;

        // HOTS: 019597F5
        nError = PathFragmentTable.LoadFromStream(InStream);
        if(nError != ERROR_SUCCESS)
            return nError;

        // HOTS: 0195980A
        if(CollisionHiBitsIndexes.ValidItemCount != 0 && PathFragmentTable.PathFragments.ItemCount == 0)
        {
            TFileNameDatabase * pNewDB;

            pNewDB = new TFileNameDatabase;
            if (pNewDB == NULL)
                return ERROR_NOT_ENOUGH_MEMORY;

            nError = SetChildDatabase(pNewDB);
            if(nError != ERROR_SUCCESS)
                return nError;

            nError = pChildDB->LoadFromStream(InStream);
            if(nError != ERROR_SUCCESS)
                return nError;
        }

        // HOTS: 0195986B
        nError = HashTable.LoadFromStream(InStream);
        if(nError != ERROR_SUCCESS)
            return nError;

        HashTableMask = HashTable.ItemCount - 1;

        nError = InStream.GetValue<DWORD>(field_214);
        if(nError != ERROR_SUCCESS)
            return nError;

        nError = InStream.GetValue<DWORD>(dwBitMask);
        if(nError != ERROR_SUCCESS)
            return nError;

        return Struct10.sub_1957800(dwBitMask);
    }